

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
 anon_unknown.dwarf_1ba5289::InferScript
           (CScript *script,ParseScriptContext ctx,SigningProvider *provider)

{
  span<const_unsigned_char,_18446744073709551615UL> bytes;
  Span<const_unsigned_char> _vch;
  Span<const_unsigned_char> vch;
  Span<const_unsigned_char> vch_00;
  Span<const_unsigned_char> _vch_00;
  Span<const_unsigned_char> vch_01;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first;
  bool bVar1;
  byte bVar2;
  bool bVar3;
  size_type sVar4;
  TxoutType TVar5;
  uchar *puVar6;
  size_type sVar7;
  __tuple_element_t<2UL,_tuple<int,_vector<unsigned_char,_allocator<unsigned_char>_>,_int>_> *p_Var8
  ;
  long *in_RCX;
  int in_EDX;
  DescriptorImpl *in_RDI;
  long in_FS_OFFSET;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *key_3;
  vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
  *__range3;
  MiniscriptContext script_ctx;
  type *leaf_ver;
  type *script_1;
  type *depth;
  vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
  *__range4;
  bool ok_1;
  size_t i;
  bool ok;
  TxoutType txntype;
  unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
  *ret;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  keys;
  NodeRef<typename_KeyParser::Key> node;
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  key_2;
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  key_1;
  unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
  subdesc;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> depths;
  vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
  subscripts;
  unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
  sub_1;
  unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
  sub;
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  pubkey_provider_3;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  providers;
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  pubkey_provider_2;
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  pubkey_provider_1;
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  pubkey_provider;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  data;
  optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
  tree;
  CTxDestination dest;
  KeyParser parser;
  TaprootSpendData tap;
  XOnlyPubKey pubkey_4;
  CScript subscript_1;
  CScriptID scriptid_1;
  CScript subscript;
  CScriptID scriptid;
  uint160 hash_2;
  CPubKey pubkey_3;
  CPubKey pubkey_2;
  CKeyID keyid_1;
  uint160 hash_1;
  CPubKey pubkey_1;
  CKeyID keyid;
  uint160 hash;
  CPubKey pubkey;
  XOnlyPubKey key;
  TaprootSpendData *in_stack_fffffffffffff8b8;
  uint32_t in_stack_fffffffffffff8c0;
  MiniscriptContext in_stack_fffffffffffff8c4;
  undefined7 in_stack_fffffffffffff8c8;
  byte in_stack_fffffffffffff8cf;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffff8d0;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this;
  undefined7 in_stack_fffffffffffff8d8;
  undefined1 in_stack_fffffffffffff8df;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffff8e0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffff8e8;
  undefined5 in_stack_fffffffffffff8f0;
  undefined1 in_stack_fffffffffffff8f5;
  undefined1 in_stack_fffffffffffff8f6;
  byte in_stack_fffffffffffff8f7;
  KeyParser *in_stack_fffffffffffff8f8;
  CPubKey *in_stack_fffffffffffff900;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff908;
  ParseScriptContext ctx_00;
  XOnlyPubKey *in_stack_fffffffffffff910;
  undefined7 in_stack_fffffffffffff918;
  byte in_stack_fffffffffffff91f;
  _Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false> scriptPubKey;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffff9e0;
  CScript *in_stack_fffffffffffff9e8;
  XOnlyPubKey *in_stack_fffffffffffff9f8;
  undefined7 in_stack_fffffffffffffa00;
  undefined1 in_stack_fffffffffffffa07;
  long local_5e8;
  int local_5d4;
  SigningProvider *in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa48;
  size_t local_4d0;
  uchar *local_4c8;
  KeyParser local_400 [2];
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_360 [6];
  undefined1 local_2a0 [112];
  undefined1 local_230 [32];
  XOnlyPubKey local_210;
  uchar local_1f0 [20];
  undefined1 local_1dc [20];
  undefined1 local_1c8 [36];
  undefined1 local_1a4 [105];
  undefined1 local_13b [65];
  undefined1 local_fa [40];
  undefined1 local_d2 [65];
  undefined1 local_91 [137];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  scriptPubKey._M_head_impl = in_RDI;
  if ((((in_EDX == 4) &&
       (sVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                          ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                           CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8)),
       sVar4 == 0x22)) &&
      (puVar6 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                          ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                           CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                           in_stack_fffffffffffff8c4), *puVar6 == ' ')) &&
     (puVar6 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                         ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                          CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                          in_stack_fffffffffffff8c4), *puVar6 == 0xac)) {
    Span<const_unsigned_char>::Span<CScript>
              ((Span<const_unsigned_char> *)
               CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
               (CScript *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
               in_stack_fffffffffffff8b8);
    ctx_00 = (ParseScriptContext)((ulong)in_stack_fffffffffffff908 >> 0x20);
    local_400[0]._64_16_ =
         (undefined1  [16])
         Span<const_unsigned_char>::subspan
                   ((Span<const_unsigned_char> *)
                    CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                    (size_t)in_stack_fffffffffffff8d0._M_current,
                    CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
    std::span<const_unsigned_char,_18446744073709551615UL>::span<Span<const_unsigned_char>_>
              ((span<const_unsigned_char,_18446744073709551615UL> *)
               CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
               (Span<const_unsigned_char> *)
               CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
    bytes._M_extent._M_extent_value._0_7_ = in_stack_fffffffffffff8d8;
    bytes._M_ptr = in_stack_fffffffffffff8d0._M_current;
    bytes._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffff8df;
    XOnlyPubKey::XOnlyPubKey(&in_stack_fffffffffffff8b8->internal_key,bytes);
    InferXOnlyPubkey(in_stack_fffffffffffff910,ctx_00,(SigningProvider *)in_stack_fffffffffffff900);
    local_400[0].m_keys.
    super__Vector_base<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._7_1_ = 1;
    std::
    make_unique<(anonymous_namespace)::PKDescriptor,std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,bool>
              ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                *)in_stack_fffffffffffff8f8,
               (bool *)CONCAT17(in_stack_fffffffffffff8f7,
                                CONCAT16(in_stack_fffffffffffff8f6,
                                         CONCAT15(in_stack_fffffffffffff8f5,
                                                  in_stack_fffffffffffff8f0))));
    std::
    unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>
    ::
    unique_ptr<(anonymous_namespace)::PKDescriptor,std::default_delete<(anonymous_namespace)::PKDescriptor>,void>
              ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
               (unique_ptr<(anonymous_namespace)::PKDescriptor,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
                *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
    std::
    unique_ptr<(anonymous_namespace)::PKDescriptor,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
    ::~unique_ptr((unique_ptr<(anonymous_namespace)::PKDescriptor,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
                   *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
    std::
    unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
    ::~unique_ptr((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                   *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
    goto LAB_00e71b48;
  }
  if (in_EDX == 4) {
    InferMultiA((CScript *)in_stack_fffffffffffff900,
                (ParseScriptContext)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
                (SigningProvider *)
                CONCAT17(in_stack_fffffffffffff8f7,
                         CONCAT16(in_stack_fffffffffffff8f6,
                                  CONCAT15(in_stack_fffffffffffff8f5,in_stack_fffffffffffff8f0))));
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                        *)in_stack_fffffffffffff8b8);
    if (bVar1) goto LAB_00e71b48;
    std::
    unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
    ::~unique_ptr((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                   *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)in_stack_fffffffffffff8b8);
  TVar5 = Solver(in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
  if ((TVar5 == PUBKEY) && (((in_EDX == 0 || (in_EDX == 1)) || (in_EDX == 3)))) {
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                 CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)
               CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
               in_stack_fffffffffffff8b8);
    _vch.m_size._0_7_ = in_stack_fffffffffffff8d8;
    _vch.m_data = in_stack_fffffffffffff8d0._M_current;
    _vch.m_size._7_1_ = in_stack_fffffffffffff8df;
    CPubKey::CPubKey((CPubKey *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),_vch);
    InferPubkey(in_stack_fffffffffffff900,
                (ParseScriptContext)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
                (SigningProvider *)
                CONCAT17(in_stack_fffffffffffff8f7,
                         CONCAT16(in_stack_fffffffffffff8f6,
                                  CONCAT15(in_stack_fffffffffffff8f5,in_stack_fffffffffffff8f0))));
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                        *)in_stack_fffffffffffff8b8);
    if (bVar1) {
      std::
      make_unique<(anonymous_namespace)::PKDescriptor,std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
                ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                  *)in_stack_fffffffffffff8f8);
      std::
      unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>
      ::
      unique_ptr<(anonymous_namespace)::PKDescriptor,std::default_delete<(anonymous_namespace)::PKDescriptor>,void>
                ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                  *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                 (unique_ptr<(anonymous_namespace)::PKDescriptor,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
                  *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
      std::
      unique_ptr<(anonymous_namespace)::PKDescriptor,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
      ::~unique_ptr((unique_ptr<(anonymous_namespace)::PKDescriptor,_std::default_delete<(anonymous_namespace)::PKDescriptor>_>
                     *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
    }
    std::
    unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
    ::~unique_ptr((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                   *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
    if (!bVar1) goto LAB_00e706db;
  }
  else {
LAB_00e706db:
    if ((TVar5 == PUBKEYHASH) && (((in_EDX == 0 || (in_EDX == 1)) || (in_EDX == 3)))) {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                   CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
      Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<const_unsigned_char> *)
                 CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
                 in_stack_fffffffffffff8b8);
      vch.m_size._0_7_ = in_stack_fffffffffffff8d8;
      vch.m_data = in_stack_fffffffffffff8d0._M_current;
      vch.m_size._7_1_ = in_stack_fffffffffffff8df;
      uint160::uint160((uint160 *)in_stack_fffffffffffff8b8,vch);
      CKeyID::CKeyID((CKeyID *)in_stack_fffffffffffff8b8,(uint160 *)0xe70772);
      CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffff8b8);
      bVar2 = (**(code **)(*in_RCX + 0x20))(in_RCX,local_91,local_d2);
      if ((bVar2 & 1) != 0) {
        InferPubkey(in_stack_fffffffffffff900,
                    (ParseScriptContext)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
                    (SigningProvider *)
                    CONCAT17(in_stack_fffffffffffff8f7,
                             CONCAT16(in_stack_fffffffffffff8f6,
                                      CONCAT15(in_stack_fffffffffffff8f5,in_stack_fffffffffffff8f0))
                            ));
        bVar1 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                            *)in_stack_fffffffffffff8b8);
        if (bVar1) {
          std::
          make_unique<(anonymous_namespace)::PKHDescriptor,std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
                    ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                      *)in_stack_fffffffffffff8f8);
          std::
          unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>
          ::
          unique_ptr<(anonymous_namespace)::PKHDescriptor,std::default_delete<(anonymous_namespace)::PKHDescriptor>,void>
                    ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                      *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                     (unique_ptr<(anonymous_namespace)::PKHDescriptor,_std::default_delete<(anonymous_namespace)::PKHDescriptor>_>
                      *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
          std::
          unique_ptr<(anonymous_namespace)::PKHDescriptor,_std::default_delete<(anonymous_namespace)::PKHDescriptor>_>
          ::~unique_ptr((unique_ptr<(anonymous_namespace)::PKHDescriptor,_std::default_delete<(anonymous_namespace)::PKHDescriptor>_>
                         *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
        }
        std::
        unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
        ::~unique_ptr((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                       *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
        if (bVar1) goto LAB_00e71b2a;
      }
    }
    if ((TVar5 == WITNESS_V0_KEYHASH) && ((in_EDX == 0 || (in_EDX == 1)))) {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                   CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
      Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<const_unsigned_char> *)
                 CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
                 in_stack_fffffffffffff8b8);
      vch_00.m_size._0_7_ = in_stack_fffffffffffff8d8;
      vch_00.m_data = in_stack_fffffffffffff8d0._M_current;
      vch_00.m_size._7_1_ = in_stack_fffffffffffff8df;
      uint160::uint160((uint160 *)in_stack_fffffffffffff8b8,vch_00);
      CKeyID::CKeyID((CKeyID *)in_stack_fffffffffffff8b8,(uint160 *)0xe70920);
      CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffff8b8);
      bVar2 = (**(code **)(*in_RCX + 0x20))(in_RCX,local_fa,local_13b);
      if ((bVar2 & 1) != 0) {
        InferPubkey(in_stack_fffffffffffff900,
                    (ParseScriptContext)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
                    (SigningProvider *)
                    CONCAT17(in_stack_fffffffffffff8f7,
                             CONCAT16(in_stack_fffffffffffff8f6,
                                      CONCAT15(in_stack_fffffffffffff8f5,in_stack_fffffffffffff8f0))
                            ));
        bVar1 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                            *)in_stack_fffffffffffff8b8);
        if (bVar1) {
          std::
          make_unique<(anonymous_namespace)::WPKHDescriptor,std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
                    ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                      *)in_stack_fffffffffffff8f8);
          std::
          unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>
          ::
          unique_ptr<(anonymous_namespace)::WPKHDescriptor,std::default_delete<(anonymous_namespace)::WPKHDescriptor>,void>
                    ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                      *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                     (unique_ptr<(anonymous_namespace)::WPKHDescriptor,_std::default_delete<(anonymous_namespace)::WPKHDescriptor>_>
                      *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
          std::
          unique_ptr<(anonymous_namespace)::WPKHDescriptor,_std::default_delete<(anonymous_namespace)::WPKHDescriptor>_>
          ::~unique_ptr((unique_ptr<(anonymous_namespace)::WPKHDescriptor,_std::default_delete<(anonymous_namespace)::WPKHDescriptor>_>
                         *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
        }
        std::
        unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
        ::~unique_ptr((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                       *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
        if (bVar1) goto LAB_00e71b2a;
      }
    }
    if ((TVar5 == MULTISIG) && (((in_EDX == 0 || (in_EDX == 1)) || (in_EDX == 3)))) {
      bVar1 = true;
      std::
      vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ::vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                *)in_stack_fffffffffffff8b8);
      for (local_5e8 = 1;
          sVar7 = std::
                  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)in_stack_fffffffffffff8b8), local_5e8 + 1U < sVar7;
          local_5e8 = local_5e8 + 1) {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                     CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
        Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((Span<const_unsigned_char> *)
                   CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
                   in_stack_fffffffffffff8b8);
        _vch_00.m_size._0_7_ = in_stack_fffffffffffff8d8;
        _vch_00.m_data = in_stack_fffffffffffff8d0._M_current;
        _vch_00.m_size._7_1_ = in_stack_fffffffffffff8df;
        CPubKey::CPubKey((CPubKey *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                         _vch_00);
        InferPubkey(in_stack_fffffffffffff900,
                    (ParseScriptContext)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
                    (SigningProvider *)
                    CONCAT17(in_stack_fffffffffffff8f7,
                             CONCAT16(in_stack_fffffffffffff8f6,
                                      CONCAT15(in_stack_fffffffffffff8f5,in_stack_fffffffffffff8f0))
                            ));
        bVar3 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                            *)in_stack_fffffffffffff8b8);
        if (bVar3) {
          std::
          vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
          ::push_back((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                       *)in_stack_fffffffffffff8b8,(value_type *)0xe70b5d);
        }
        else {
          bVar1 = false;
        }
        std::
        unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
        ::~unique_ptr((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                       *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
        if (!bVar3) break;
      }
      if (bVar1) {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                     CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                   CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
        std::
        make_unique<(anonymous_namespace)::MultisigDescriptor,int,std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>>
                  ((int *)in_stack_fffffffffffff908,
                   (vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                    *)in_stack_fffffffffffff900);
        std::
        unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>
        ::
        unique_ptr<(anonymous_namespace)::MultisigDescriptor,std::default_delete<(anonymous_namespace)::MultisigDescriptor>,void>
                  ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                    *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                   (unique_ptr<(anonymous_namespace)::MultisigDescriptor,_std::default_delete<(anonymous_namespace)::MultisigDescriptor>_>
                    *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
        std::
        unique_ptr<(anonymous_namespace)::MultisigDescriptor,_std::default_delete<(anonymous_namespace)::MultisigDescriptor>_>
        ::~unique_ptr((unique_ptr<(anonymous_namespace)::MultisigDescriptor,_std::default_delete<(anonymous_namespace)::MultisigDescriptor>_>
                       *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
      }
      std::
      vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
      ::~vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
      if (bVar1) goto LAB_00e71b2a;
    }
    if ((TVar5 == SCRIPTHASH) && (in_EDX == 0)) {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                   CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
      Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<const_unsigned_char> *)
                 CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
                 in_stack_fffffffffffff8b8);
      vch_01.m_size._0_7_ = in_stack_fffffffffffff8d8;
      vch_01.m_data = in_stack_fffffffffffff8d0._M_current;
      vch_01.m_size._7_1_ = in_stack_fffffffffffff8df;
      uint160::uint160((uint160 *)in_stack_fffffffffffff8b8,vch_01);
      CScriptID::CScriptID((CScriptID *)in_stack_fffffffffffff8b8,(uint160 *)0xe70d4e);
      CScript::CScript((CScript *)in_stack_fffffffffffff8b8);
      bVar2 = (**(code **)(*in_RCX + 0x10))(in_RCX,local_1a4,local_1c8);
      if ((bVar2 & 1) == 0) {
LAB_00e70e7b:
        bVar1 = false;
      }
      else {
        InferScript((CScript *)CONCAT44(in_EDX,in_stack_fffffffffffffa48),
                    (ParseScriptContext)((ulong)in_RCX >> 0x20),in_stack_fffffffffffffa38);
        bVar1 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                            *)in_stack_fffffffffffff8b8);
        if (bVar1) {
          std::
          make_unique<(anonymous_namespace)::SHDescriptor,std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>>
                    ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                      *)in_stack_fffffffffffff8f8);
          std::
          unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>
          ::
          unique_ptr<(anonymous_namespace)::SHDescriptor,std::default_delete<(anonymous_namespace)::SHDescriptor>,void>
                    ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                      *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                     (unique_ptr<(anonymous_namespace)::SHDescriptor,_std::default_delete<(anonymous_namespace)::SHDescriptor>_>
                      *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
          std::
          unique_ptr<(anonymous_namespace)::SHDescriptor,_std::default_delete<(anonymous_namespace)::SHDescriptor>_>
          ::~unique_ptr((unique_ptr<(anonymous_namespace)::SHDescriptor,_std::default_delete<(anonymous_namespace)::SHDescriptor>_>
                         *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
        }
        std::
        unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
        ::~unique_ptr((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                       *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
        if (!bVar1) goto LAB_00e70e7b;
      }
      CScript::~CScript((CScript *)in_stack_fffffffffffff8b8);
      if (bVar1 != false) goto LAB_00e71b2a;
    }
    if ((TVar5 == WITNESS_V0_SCRIPTHASH) && ((in_EDX == 0 || (in_EDX == 1)))) {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                   CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
      Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<const_unsigned_char> *)
                 CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0),
                 in_stack_fffffffffffff8b8);
      RIPEMD160(local_1f0,local_4d0,local_4c8);
      CScriptID::CScriptID((CScriptID *)in_stack_fffffffffffff8b8,(uint160 *)0xe70f3f);
      in_stack_fffffffffffff910 = &local_210;
      CScript::CScript((CScript *)in_stack_fffffffffffff8b8);
      in_stack_fffffffffffff91f =
           (**(code **)(*in_RCX + 0x10))(in_RCX,local_1dc,in_stack_fffffffffffff910);
      if ((in_stack_fffffffffffff91f & 1) == 0) {
LAB_00e7106c:
        bVar1 = false;
      }
      else {
        InferScript((CScript *)CONCAT44(in_EDX,in_stack_fffffffffffffa48),
                    (ParseScriptContext)((ulong)in_RCX >> 0x20),in_stack_fffffffffffffa38);
        bVar1 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                            *)in_stack_fffffffffffff8b8);
        if (bVar1) {
          std::
          make_unique<(anonymous_namespace)::WSHDescriptor,std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>>
                    ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                      *)in_stack_fffffffffffff8f8);
          std::
          unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>
          ::
          unique_ptr<(anonymous_namespace)::WSHDescriptor,std::default_delete<(anonymous_namespace)::WSHDescriptor>,void>
                    ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                      *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                     (unique_ptr<(anonymous_namespace)::WSHDescriptor,_std::default_delete<(anonymous_namespace)::WSHDescriptor>_>
                      *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
          std::
          unique_ptr<(anonymous_namespace)::WSHDescriptor,_std::default_delete<(anonymous_namespace)::WSHDescriptor>_>
          ::~unique_ptr((unique_ptr<(anonymous_namespace)::WSHDescriptor,_std::default_delete<(anonymous_namespace)::WSHDescriptor>_>
                         *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
        }
        std::
        unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
        ::~unique_ptr((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                       *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
        if (!bVar1) goto LAB_00e7106c;
      }
      CScript::~CScript((CScript *)in_stack_fffffffffffff8b8);
      if (bVar1 != false) goto LAB_00e71b2a;
    }
    if ((TVar5 == WITNESS_V1_TAPROOT) && (in_EDX == 0)) {
      XOnlyPubKey::XOnlyPubKey(&in_stack_fffffffffffff8b8->internal_key);
      in_stack_fffffffffffff900 = (CPubKey *)0x0;
      in_stack_fffffffffffff8f8 = local_400;
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                   CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                   CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
      in_stack_fffffffffffff908 =
           (vector<int,_std::allocator<int>_> *)
           XOnlyPubKey::begin(&in_stack_fffffffffffff8b8->internal_key);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
                (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
                 (uchar *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
      TaprootSpendData::TaprootSpendData(in_stack_fffffffffffff8b8);
      in_stack_fffffffffffff8f7 = (**(code **)(*in_RCX + 0x40))(in_RCX,local_230,local_2a0);
      if ((in_stack_fffffffffffff8f7 & 1) == 0) {
LAB_00e715c2:
        in_stack_fffffffffffff8f6 =
             XOnlyPubKey::IsFullyValid
                       ((XOnlyPubKey *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8)
                       );
        if ((bool)in_stack_fffffffffffff8f6) {
          InferXOnlyPubkey(in_stack_fffffffffffff910,
                           (ParseScriptContext)((ulong)in_stack_fffffffffffff908 >> 0x20),
                           (SigningProvider *)in_stack_fffffffffffff900);
          bVar1 = std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                              *)in_stack_fffffffffffff8b8);
          if (bVar1) {
            std::
            make_unique<(anonymous_namespace)::RawTRDescriptor,std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
                      ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                        *)in_stack_fffffffffffff8f8);
            std::
            unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>
            ::
            unique_ptr<(anonymous_namespace)::RawTRDescriptor,std::default_delete<(anonymous_namespace)::RawTRDescriptor>,void>
                      ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                        *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                       (unique_ptr<(anonymous_namespace)::RawTRDescriptor,_std::default_delete<(anonymous_namespace)::RawTRDescriptor>_>
                        *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
            std::
            unique_ptr<(anonymous_namespace)::RawTRDescriptor,_std::default_delete<(anonymous_namespace)::RawTRDescriptor>_>
            ::~unique_ptr((unique_ptr<(anonymous_namespace)::RawTRDescriptor,_std::default_delete<(anonymous_namespace)::RawTRDescriptor>_>
                           *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
          }
          std::
          unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
          ::~unique_ptr((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                         *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
          if (bVar1) goto LAB_00e716b8;
        }
        bVar1 = false;
      }
      else {
        InferTaprootTree((TaprootSpendData *)
                         CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                         in_stack_fffffffffffff9f8);
        bVar1 = std::optional::operator_cast_to_bool
                          ((optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                            *)in_stack_fffffffffffff8b8);
        if (bVar1) {
          bVar2 = 1;
          std::
          vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
          ::vector((vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                    *)in_stack_fffffffffffff8b8);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8b8);
          std::
          optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
          ::operator*((optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                       *)in_stack_fffffffffffff8b8);
          std::
          vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
          ::begin((vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                   *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
          std::
          vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
          ::end((vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                 *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
          while (bVar1 = __gnu_cxx::
                         operator==<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_*,_std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                                   ((__normal_iterator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_*,_std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                                     *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8)
                                    ,(__normal_iterator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_*,_std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                                      *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0
                                                )), ((bVar1 ^ 0xffU) & 1) != 0) {
            __gnu_cxx::
            __normal_iterator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_*,_std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
            ::operator*((__normal_iterator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_*,_std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                         *)in_stack_fffffffffffff8b8);
            std::get<0ul,int,std::vector<unsigned_char,std::allocator<unsigned_char>>,int>
                      ((tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>
                        *)in_stack_fffffffffffff8b8);
            std::get<1ul,int,std::vector<unsigned_char,std::allocator<unsigned_char>>,int>
                      ((tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>
                        *)in_stack_fffffffffffff8b8);
            p_Var8 = std::get<2ul,int,std::vector<unsigned_char,std::allocator<unsigned_char>>,int>
                               ((tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>
                                 *)in_stack_fffffffffffff8b8);
            std::
            unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>
            ::unique_ptr<std::default_delete<(anonymous_namespace)::DescriptorImpl>,void>
                      ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                        *)in_stack_fffffffffffff8b8);
            if (*p_Var8 == 0xc0) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
              first._M_current._7_1_ = in_stack_fffffffffffff8df;
              first._M_current._0_7_ = in_stack_fffffffffffff8d8;
              CScript::
              CScript<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ((CScript *)in_stack_fffffffffffff8b8,first,in_stack_fffffffffffff8d0);
              InferScript((CScript *)CONCAT44(in_EDX,in_stack_fffffffffffffa48),
                          (ParseScriptContext)((ulong)in_RCX >> 0x20),in_stack_fffffffffffffa38);
              std::
              unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
              ::operator=((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                           *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                          (unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                           *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
              std::
              unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
              ::~unique_ptr((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                             *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
              CScript::~CScript((CScript *)in_stack_fffffffffffff8b8);
            }
            bVar1 = std::unique_ptr::operator_cast_to_bool
                              ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                                *)in_stack_fffffffffffff8b8);
            if (bVar1) {
              std::
              vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
              ::push_back((vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                           *)in_stack_fffffffffffff8b8,(value_type *)0xe713f9);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                         (value_type_conflict4 *)
                         CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
              local_5d4 = 0;
            }
            else {
              bVar2 = 0;
              local_5d4 = 5;
            }
            std::
            unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
            ::~unique_ptr((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                           *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
            if (local_5d4 != 0) break;
            __gnu_cxx::
            __normal_iterator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_*,_std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
            ::operator++((__normal_iterator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_*,_std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                          *)in_stack_fffffffffffff8b8);
          }
          bVar1 = (bVar2 & 1) != 0;
          if (bVar1) {
            InferXOnlyPubkey(in_stack_fffffffffffff910,
                             (ParseScriptContext)((ulong)in_stack_fffffffffffff908 >> 0x20),
                             (SigningProvider *)in_stack_fffffffffffff900);
            std::
            make_unique<(anonymous_namespace)::TRDescriptor,std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>,std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>>>,std::vector<int,std::allocator<int>>>
                      ((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                        *)CONCAT17(in_stack_fffffffffffff91f,in_stack_fffffffffffff918),
                       (vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                        *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
            std::
            unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>
            ::
            unique_ptr<(anonymous_namespace)::TRDescriptor,std::default_delete<(anonymous_namespace)::TRDescriptor>,void>
                      ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                        *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                       (unique_ptr<(anonymous_namespace)::TRDescriptor,_std::default_delete<(anonymous_namespace)::TRDescriptor>_>
                        *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
            std::
            unique_ptr<(anonymous_namespace)::TRDescriptor,_std::default_delete<(anonymous_namespace)::TRDescriptor>_>
            ::~unique_ptr((unique_ptr<(anonymous_namespace)::TRDescriptor,_std::default_delete<(anonymous_namespace)::TRDescriptor>_>
                           *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
            std::
            unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
            ::~unique_ptr((unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                           *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
          }
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
          std::
          vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
          ::~vector((vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
          if (!bVar1) goto LAB_00e71597;
        }
        else {
LAB_00e71597:
          bVar1 = false;
        }
        std::
        optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
        ::~optional((optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                     *)in_stack_fffffffffffff8b8);
        if (bVar1 == false) goto LAB_00e715c2;
      }
LAB_00e716b8:
      TaprootSpendData::~TaprootSpendData(in_stack_fffffffffffff8b8);
      if (bVar1 != false) goto LAB_00e71b2a;
    }
    if ((in_EDX == 3) || (in_EDX == 4)) {
      KeyParser::KeyParser
                ((KeyParser *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                 (FlatSigningProvider *)in_stack_fffffffffffff8d0._M_current,
                 (SigningProvider *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                 in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0);
      miniscript::FromScript<(anonymous_namespace)::KeyParser>
                ((CScript *)in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                          *)in_stack_fffffffffffff8b8);
      if (bVar1) {
        std::
        __shared_ptr_access<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_fffffffffffff8b8);
        in_stack_fffffffffffff8f5 =
             miniscript::Node<unsigned_int>::IsSane
                       ((Node<unsigned_int> *)
                        CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
        if (!(bool)in_stack_fffffffffffff8f5) goto LAB_00e71937;
        std::
        vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        ::vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                  *)in_stack_fffffffffffff8b8);
        std::
        vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
        ::size((vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                *)in_stack_fffffffffffff8b8);
        std::
        vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        ::reserve((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                   *)in_stack_fffffffffffff8f8,
                  CONCAT17(in_stack_fffffffffffff8f7,
                           CONCAT16(in_stack_fffffffffffff8f6,
                                    CONCAT15(in_stack_fffffffffffff8f5,in_stack_fffffffffffff8f0))))
        ;
        std::
        vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
        ::begin((vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
        std::
        vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
        ::end((vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
        while (bVar1 = __gnu_cxx::
                       operator==<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_*,_std::vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>_>
                                 ((__normal_iterator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_*,_std::vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                                  (__normal_iterator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_*,_std::vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0)),
              ((bVar1 ^ 0xffU) & 1) != 0) {
          __gnu_cxx::
          __normal_iterator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_*,_std::vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>_>
          ::operator*((__normal_iterator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_*,_std::vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>_>
                       *)in_stack_fffffffffffff8b8);
          in_stack_fffffffffffff8e0._M_current =
               (uchar *)std::
                        vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                        ::at((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                              *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                             CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
          std::
          vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>
          ::
          emplace_back<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>
                    ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                     (unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                      *)in_stack_fffffffffffff8d0._M_current);
          __gnu_cxx::
          __normal_iterator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_*,_std::vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>_>
          ::operator++((__normal_iterator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_*,_std::vector<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>,_std::allocator<std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>_>_>_>
                        *)in_stack_fffffffffffff8b8);
        }
        std::
        make_unique<(anonymous_namespace)::MiniscriptDescriptor,std::vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>,std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,std::default_delete<(anonymous_namespace)::PubkeyProvider>>>>,std::shared_ptr<miniscript::Node<unsigned_int>const>>
                  ((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                    *)in_stack_fffffffffffff908,
                   (shared_ptr<const_miniscript::Node<unsigned_int>_> *)in_stack_fffffffffffff900);
        std::
        unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>
        ::
        unique_ptr<(anonymous_namespace)::MiniscriptDescriptor,std::default_delete<(anonymous_namespace)::MiniscriptDescriptor>,void>
                  ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                    *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                   (unique_ptr<(anonymous_namespace)::MiniscriptDescriptor,_std::default_delete<(anonymous_namespace)::MiniscriptDescriptor>_>
                    *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
        std::
        unique_ptr<(anonymous_namespace)::MiniscriptDescriptor,_std::default_delete<(anonymous_namespace)::MiniscriptDescriptor>_>
        ::~unique_ptr((unique_ptr<(anonymous_namespace)::MiniscriptDescriptor,_std::default_delete<(anonymous_namespace)::MiniscriptDescriptor>_>
                       *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
        bVar1 = true;
        std::
        vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        ::~vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
      }
      else {
LAB_00e71937:
        bVar1 = false;
      }
      std::shared_ptr<const_miniscript::Node<unsigned_int>_>::~shared_ptr
                ((shared_ptr<const_miniscript::Node<unsigned_int>_> *)in_stack_fffffffffffff8b8);
      KeyParser::~KeyParser((KeyParser *)in_stack_fffffffffffff8b8);
      if (bVar1) goto LAB_00e71b2a;
    }
    if (in_EDX == 0) {
      this = local_360;
      std::
      variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 *)in_stack_fffffffffffff8b8);
      bVar1 = ExtractDestination((CScript *)scriptPubKey._M_head_impl,(CTxDestination *)in_RDI);
      if (bVar1) {
        GetScriptForDestination((CTxDestination *)in_stack_fffffffffffff8b8);
        in_stack_fffffffffffff8cf =
             prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                       (this,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                             CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
        CScript::~CScript((CScript *)in_stack_fffffffffffff8b8);
        if ((in_stack_fffffffffffff8cf & 1) == 0) goto LAB_00e71ac8;
        std::
        make_unique<(anonymous_namespace)::AddressDescriptor,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>
                  ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    *)CONCAT17(in_stack_fffffffffffff8f7,
                               CONCAT16(in_stack_fffffffffffff8f6,
                                        CONCAT15(in_stack_fffffffffffff8f5,in_stack_fffffffffffff8f0
                                                ))));
        std::
        unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>
        ::
        unique_ptr<(anonymous_namespace)::AddressDescriptor,std::default_delete<(anonymous_namespace)::AddressDescriptor>,void>
                  ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                    *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                   (unique_ptr<(anonymous_namespace)::AddressDescriptor,_std::default_delete<(anonymous_namespace)::AddressDescriptor>_>
                    *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
        std::
        unique_ptr<(anonymous_namespace)::AddressDescriptor,_std::default_delete<(anonymous_namespace)::AddressDescriptor>_>
        ::~unique_ptr((unique_ptr<(anonymous_namespace)::AddressDescriptor,_std::default_delete<(anonymous_namespace)::AddressDescriptor>_>
                       *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
      }
      else {
LAB_00e71ac8:
        std::make_unique<(anonymous_namespace)::RawDescriptor,CScript_const&>
                  ((CScript *)in_stack_fffffffffffff8e0._M_current);
        std::
        unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>
        ::
        unique_ptr<(anonymous_namespace)::RawDescriptor,std::default_delete<(anonymous_namespace)::RawDescriptor>,void>
                  ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                    *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                   (unique_ptr<(anonymous_namespace)::RawDescriptor,_std::default_delete<(anonymous_namespace)::RawDescriptor>_>
                    *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
        std::
        unique_ptr<(anonymous_namespace)::RawDescriptor,_std::default_delete<(anonymous_namespace)::RawDescriptor>_>
        ::~unique_ptr((unique_ptr<(anonymous_namespace)::RawDescriptor,_std::default_delete<(anonymous_namespace)::RawDescriptor>_>
                       *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
      }
      std::
      variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  *)in_stack_fffffffffffff8b8);
    }
    else {
      std::
      unique_ptr<(anonymous_namespace)::DescriptorImpl,std::default_delete<(anonymous_namespace)::DescriptorImpl>>
      ::unique_ptr<std::default_delete<(anonymous_namespace)::DescriptorImpl>,void>
                ((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                  *)in_stack_fffffffffffff8b8,(nullptr_t)0xe719a9);
    }
  }
LAB_00e71b2a:
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
LAB_00e71b48:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (__uniq_ptr_data<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>,_true,_true>
            )(tuple<(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
              )scriptPubKey._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<DescriptorImpl> InferScript(const CScript& script, ParseScriptContext ctx, const SigningProvider& provider)
{
    if (ctx == ParseScriptContext::P2TR && script.size() == 34 && script[0] == 32 && script[33] == OP_CHECKSIG) {
        XOnlyPubKey key{Span{script}.subspan(1, 32)};
        return std::make_unique<PKDescriptor>(InferXOnlyPubkey(key, ctx, provider), true);
    }

    if (ctx == ParseScriptContext::P2TR) {
        auto ret = InferMultiA(script, ctx, provider);
        if (ret) return ret;
    }

    std::vector<std::vector<unsigned char>> data;
    TxoutType txntype = Solver(script, data);

    if (txntype == TxoutType::PUBKEY && (ctx == ParseScriptContext::TOP || ctx == ParseScriptContext::P2SH || ctx == ParseScriptContext::P2WSH)) {
        CPubKey pubkey(data[0]);
        if (auto pubkey_provider = InferPubkey(pubkey, ctx, provider)) {
            return std::make_unique<PKDescriptor>(std::move(pubkey_provider));
        }
    }
    if (txntype == TxoutType::PUBKEYHASH && (ctx == ParseScriptContext::TOP || ctx == ParseScriptContext::P2SH || ctx == ParseScriptContext::P2WSH)) {
        uint160 hash(data[0]);
        CKeyID keyid(hash);
        CPubKey pubkey;
        if (provider.GetPubKey(keyid, pubkey)) {
            if (auto pubkey_provider = InferPubkey(pubkey, ctx, provider)) {
                return std::make_unique<PKHDescriptor>(std::move(pubkey_provider));
            }
        }
    }
    if (txntype == TxoutType::WITNESS_V0_KEYHASH && (ctx == ParseScriptContext::TOP || ctx == ParseScriptContext::P2SH)) {
        uint160 hash(data[0]);
        CKeyID keyid(hash);
        CPubKey pubkey;
        if (provider.GetPubKey(keyid, pubkey)) {
            if (auto pubkey_provider = InferPubkey(pubkey, ParseScriptContext::P2WPKH, provider)) {
                return std::make_unique<WPKHDescriptor>(std::move(pubkey_provider));
            }
        }
    }
    if (txntype == TxoutType::MULTISIG && (ctx == ParseScriptContext::TOP || ctx == ParseScriptContext::P2SH || ctx == ParseScriptContext::P2WSH)) {
        bool ok = true;
        std::vector<std::unique_ptr<PubkeyProvider>> providers;
        for (size_t i = 1; i + 1 < data.size(); ++i) {
            CPubKey pubkey(data[i]);
            if (auto pubkey_provider = InferPubkey(pubkey, ctx, provider)) {
                providers.push_back(std::move(pubkey_provider));
            } else {
                ok = false;
                break;
            }
        }
        if (ok) return std::make_unique<MultisigDescriptor>((int)data[0][0], std::move(providers));
    }
    if (txntype == TxoutType::SCRIPTHASH && ctx == ParseScriptContext::TOP) {
        uint160 hash(data[0]);
        CScriptID scriptid(hash);
        CScript subscript;
        if (provider.GetCScript(scriptid, subscript)) {
            auto sub = InferScript(subscript, ParseScriptContext::P2SH, provider);
            if (sub) return std::make_unique<SHDescriptor>(std::move(sub));
        }
    }
    if (txntype == TxoutType::WITNESS_V0_SCRIPTHASH && (ctx == ParseScriptContext::TOP || ctx == ParseScriptContext::P2SH)) {
        CScriptID scriptid{RIPEMD160(data[0])};
        CScript subscript;
        if (provider.GetCScript(scriptid, subscript)) {
            auto sub = InferScript(subscript, ParseScriptContext::P2WSH, provider);
            if (sub) return std::make_unique<WSHDescriptor>(std::move(sub));
        }
    }
    if (txntype == TxoutType::WITNESS_V1_TAPROOT && ctx == ParseScriptContext::TOP) {
        // Extract x-only pubkey from output.
        XOnlyPubKey pubkey;
        std::copy(data[0].begin(), data[0].end(), pubkey.begin());
        // Request spending data.
        TaprootSpendData tap;
        if (provider.GetTaprootSpendData(pubkey, tap)) {
            // If found, convert it back to tree form.
            auto tree = InferTaprootTree(tap, pubkey);
            if (tree) {
                // If that works, try to infer subdescriptors for all leaves.
                bool ok = true;
                std::vector<std::unique_ptr<DescriptorImpl>> subscripts; //!< list of script subexpressions
                std::vector<int> depths; //!< depth in the tree of each subexpression (same length subscripts)
                for (const auto& [depth, script, leaf_ver] : *tree) {
                    std::unique_ptr<DescriptorImpl> subdesc;
                    if (leaf_ver == TAPROOT_LEAF_TAPSCRIPT) {
                        subdesc = InferScript(CScript(script.begin(), script.end()), ParseScriptContext::P2TR, provider);
                    }
                    if (!subdesc) {
                        ok = false;
                        break;
                    } else {
                        subscripts.push_back(std::move(subdesc));
                        depths.push_back(depth);
                    }
                }
                if (ok) {
                    auto key = InferXOnlyPubkey(tap.internal_key, ParseScriptContext::P2TR, provider);
                    return std::make_unique<TRDescriptor>(std::move(key), std::move(subscripts), std::move(depths));
                }
            }
        }
        // If the above doesn't work, construct a rawtr() descriptor with just the encoded x-only pubkey.
        if (pubkey.IsFullyValid()) {
            auto key = InferXOnlyPubkey(pubkey, ParseScriptContext::P2TR, provider);
            if (key) {
                return std::make_unique<RawTRDescriptor>(std::move(key));
            }
        }
    }

    if (ctx == ParseScriptContext::P2WSH || ctx == ParseScriptContext::P2TR) {
        const auto script_ctx{ctx == ParseScriptContext::P2WSH ? miniscript::MiniscriptContext::P2WSH : miniscript::MiniscriptContext::TAPSCRIPT};
        KeyParser parser(/* out = */nullptr, /* in = */&provider, /* ctx = */script_ctx);
        auto node = miniscript::FromScript(script, parser);
        if (node && node->IsSane()) {
            std::vector<std::unique_ptr<PubkeyProvider>> keys;
            keys.reserve(parser.m_keys.size());
            for (auto& key : parser.m_keys) {
                keys.emplace_back(std::move(key.at(0)));
            }
            return std::make_unique<MiniscriptDescriptor>(std::move(keys), std::move(node));
        }
    }

    // The following descriptors are all top-level only descriptors.
    // So if we are not at the top level, return early.
    if (ctx != ParseScriptContext::TOP) return nullptr;

    CTxDestination dest;
    if (ExtractDestination(script, dest)) {
        if (GetScriptForDestination(dest) == script) {
            return std::make_unique<AddressDescriptor>(std::move(dest));
        }
    }

    return std::make_unique<RawDescriptor>(script);
}